

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::add_dht_router
          (session_impl *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *node)

{
  int iVar1;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this->m_outstanding_router_lookups = this->m_outstanding_router_lookups + 1;
  iVar1 = node->second;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x20);
  *(code **)local_50._M_unused._0_8_ = on_dht_router_name_lookup;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(int *)((long)local_50._M_unused._0_8_ + 0x10) = iVar1;
  *(session_impl **)((long)local_50._M_unused._0_8_ + 0x18) = this;
  local_38 = ::std::
             _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>_>
             ::_M_invoke;
  local_40 = ::std::
             _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>_>
             ::_M_manager;
  resolver::async_resolve
            (&this->m_host_resolver,&node->first,(resolver_flags)0x2,(callback_t *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void session_impl::add_dht_router(std::pair<std::string, int> const& node)
	{
		ADD_OUTSTANDING_ASYNC("session_impl::on_dht_router_name_lookup");
		++m_outstanding_router_lookups;
		m_host_resolver.async_resolve(node.first, resolver::abort_on_shutdown
			, std::bind(&session_impl::on_dht_router_name_lookup
				, this, _1, _2, node.second));
	}